

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table.cc
# Opt level: O2

void ** __thiscall tcmalloc::StackTraceTable::ReadStackTracesAndClear(StackTraceTable *this)

{
  Entry *pEVar1;
  _Head_base<0UL,_void_**,_false> _Var2;
  pointer p;
  _Head_base<0UL,_void_**,_false> local_38;
  unique_ptr<void_*[],_std::default_delete<void_*[]>_> out;
  SpinLockHolder h;
  
  ProduceStackTracesDump
            ((tcmalloc *)&local_38,ReadStackTracesAndClear::anon_class_1_0_00000001::__invoke,
             this->head_);
  this->error_ = false;
  out._M_t.super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
  super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
  super__Head_base<0UL,_void_**,_false>._M_head_impl =
       (__uniq_ptr_data<void_*,_std::default_delete<void_*[]>,_true,_true>)
       (__uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>)0x169780;
  SpinLock::Lock((SpinLock *)(Static::pageheap_ + 8));
  p = this->head_;
  while (_Var2._M_head_impl = local_38._M_head_impl, p != (pointer)0x0) {
    pEVar1 = p->next;
    STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::deallocate
              ((STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void> *)&this->field_0x10,p,1
              );
    p = pEVar1;
  }
  this->head_ = (Entry *)0x0;
  local_38._M_head_impl = (void **)0x0;
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&out);
  std::unique_ptr<void_*[],_std::default_delete<void_*[]>_>::~unique_ptr
            ((unique_ptr<void_*[],_std::default_delete<void_*[]>_> *)&local_38);
  return _Var2._M_head_impl;
}

Assistant:

void** StackTraceTable::ReadStackTracesAndClear() {
  std::unique_ptr<void*[]> out = ProduceStackTracesDump(
    +[] (const void** current_head) -> const StackTrace* {
      const Entry* head = static_cast<const Entry*>(*current_head);
      *current_head = head->next;
      return &head->trace;
    }, head_);

  // Clear state
  error_ = false;

  SpinLockHolder h(Static::pageheap_lock());
  Entry* entry = head_;
  while (entry != nullptr) {
    Entry* next = entry->next;
    allocator_.deallocate(entry, 1);
    entry = next;
  }
  head_ = nullptr;

  return out.release();
}